

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall
llvm::yaml::Output::Output(Output *this,raw_ostream *yout,void *context,int WrapColumn)

{
  SmallVectorImpl<llvm::yaml::Output::InState> *pSVar1;
  
  (this->super_IO).Ctxt = context;
  (this->super_IO)._vptr_IO = (_func_int **)&PTR__Output_01079a90;
  this->Out = yout;
  this->WrapColumn = WrapColumn;
  (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
  super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
  super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.BeginX =
       &(this->StateStack).super_SmallVectorStorage<llvm::yaml::Output::InState,_8U>;
  pSVar1 = &(this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>;
  (pSVar1->super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>).
  super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>).
  super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Capacity
       = 8;
  this->Column = 0;
  this->ColumnAtFlowStart = 0;
  this->ColumnAtMapFlowStart = 0;
  this->NeedBitValueComma = false;
  this->NeedFlowSequenceComma = false;
  this->EnumerationMatchFound = false;
  this->WriteDefaultValues = false;
  (this->Padding).Data = (char *)0x0;
  (this->Padding).Length = 0;
  (this->PaddingBeforeContainer).Data = (char *)0x0;
  (this->PaddingBeforeContainer).Length = 0;
  return;
}

Assistant:

Output::Output(raw_ostream &yout, void *context, int WrapColumn)
    : IO(context), Out(yout), WrapColumn(WrapColumn) {}